

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O1

bool __thiscall miniros::Subscription::pubUpdate(Subscription *this,V_string *new_pubs)

{
  mutex *__mutex;
  mutex *__mutex_00;
  _Rb_tree_header *p_Var1;
  pointer *ppbVar2;
  element_type *peVar3;
  pointer pcVar4;
  size_t __n;
  PublisherLink *this_00;
  pointer pcVar5;
  Level LVar6;
  void *pvVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  RPCManagerPtr *pRVar11;
  ostream *poVar12;
  string *psVar13;
  _Base_ptr p_Var14;
  string *uri2;
  value_type *__x;
  pointer psVar15;
  V_string *__range2;
  pointer pbVar16;
  char *__end;
  string *up_i;
  pointer pbVar17;
  pointer psVar18;
  string ownURI;
  V_string additions;
  V_PublisherLink subtractions;
  V_PublisherLink to_add;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->shutdown_mutex_);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  if ((this->shutting_down_ == false) && (this->dropped_ == false)) {
    pRVar11 = RPCManager::instance();
    peVar3 = (pRVar11->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ownURI._M_dataplus._M_p = (pointer)&ownURI.field_2;
    pcVar4 = (peVar3->uri_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ownURI,pcVar4,pcVar4 + (peVar3->uri_)._M_string_length);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pbVar17 = (new_pubs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar16 = (new_pubs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != pbVar16) {
      do {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8[0]._M_local_buf,(pbVar17->_M_dataplus)._M_p,
                             pbVar17->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar16);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8[0]._M_local_buf," already have these connections: ",0x21);
    __mutex = &this->publisher_links_mutex_;
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    psVar15 = (this->publisher_links_).
              super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar18 = (this->publisher_links_).
                   super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar15;
        psVar18 = psVar18 + 1) {
      psVar13 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                          ((psVar18->
                           super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8[0]._M_local_buf,(psVar13->_M_dataplus)._M_p,
                           psVar13->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __mutex_00 = &this->pending_connections_mutex_;
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    p_Var1 = &(this->pending_connections_)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var14 = (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var14 != p_Var1;
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14)) {
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8[0]._M_local_buf,
                           *(char **)(*(long *)(p_Var14 + 1) + 0x40),
                           *(long *)(*(long *)(p_Var14 + 1) + 0x48));
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (pubUpdate::loc.initialized_ == false) {
      ppbVar2 = &additions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      additions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&additions,"miniros.subscription","");
      console::initializeLogLocation(&pubUpdate::loc,(string *)&additions,Debug);
      if (additions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
        operator_delete(additions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((additions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
    }
    if (pubUpdate::loc.level_ != Debug) {
      console::setLogLocationLevel(&pubUpdate::loc,Debug);
      console::checkLogLocationEnabled(&pubUpdate::loc);
    }
    pvVar7 = pubUpdate::loc.logger_;
    LVar6 = pubUpdate::loc.level_;
    if (pubUpdate::loc.logger_enabled_ == true) {
      pcVar4 = (this->name_)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      console::print((FilterBase *)0x0,pvVar7,LVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0xf8,"bool miniros::Subscription::pubUpdate(const V_string &)",
                     "Publisher update for [%s]: %s",pcVar4,
                     additions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      if (additions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&additions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(additions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((additions.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    additions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    subtractions.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_add.
    super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    __x = (this->publisher_links_).
          super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if (__x != (this->publisher_links_).
               super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        for (pbVar17 = (new_pubs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pbVar17 !=
            (new_pubs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish; pbVar17 = pbVar17 + 1) {
          psVar13 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                              ((__x->
                               super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr);
          bVar8 = urisEqual(psVar13,pbVar17);
          if (bVar8) goto LAB_0020b288;
        }
        std::
        vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
        ::push_back(&subtractions,__x);
LAB_0020b288:
        __x = __x + 1;
      } while (__x != (this->publisher_links_).
                      super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    psVar13 = (new_pubs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (psVar13 !=
        (new_pubs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        for (psVar18 = (this->publisher_links_).
                       super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            psVar18 !=
            (this->publisher_links_).
            super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; psVar18 = psVar18 + 1) {
          uri2 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                           ((psVar18->
                            super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
          bVar8 = urisEqual(psVar13,uri2);
          if (bVar8) {
            bVar9 = true;
            bVar8 = true;
            goto LAB_0020b2ee;
          }
        }
        bVar9 = false;
        bVar8 = false;
LAB_0020b2ee:
        if (!bVar8) {
          iVar10 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
          if (iVar10 != 0) {
            std::__throw_system_error(iVar10);
          }
          p_Var14 = (this->pending_connections_)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          while ((_Rb_tree_header *)p_Var14 != p_Var1) {
            bVar8 = urisEqual(psVar13,(string *)(*(long *)(p_Var14 + 1) + 0x40));
            if (bVar8) {
              bVar8 = true;
              break;
            }
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
            bVar8 = bVar9;
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
        }
        if (!bVar8) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&additions,psVar13);
        }
        psVar13 = psVar13 + 1;
      } while (psVar13 !=
               (new_pubs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    psVar18 = subtractions.
              super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (subtractions.
        super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        subtractions.
        super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar15 = subtractions.
                super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        psVar13 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_
                            ((psVar15->
                             super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr);
        __n = psVar13->_M_string_length;
        if ((__n == ownURI._M_string_length) &&
           ((__n == 0 ||
            (iVar10 = bcmp((psVar13->_M_dataplus)._M_p,ownURI._M_dataplus._M_p,__n), iVar10 == 0))))
        {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ == false) {
            _ss = (pointer)local_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.subscription","")
            ;
            console::initializeLogLocation
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,(string *)&ss,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_ss != local_1a8) {
              operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
            }
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc);
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::loc.logger_,
                           pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x142,"bool miniros::Subscription::pubUpdate(const V_string &)",
                           "Disconnect: skipping myself for topic [%s]",
                           (this->name_)._M_dataplus._M_p);
          }
        }
        else {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ == false) {
            _ss = (pointer)local_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.subscription","")
            ;
            console::initializeLogLocation
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,(string *)&ss,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_ss != local_1a8) {
              operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
            }
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc);
          }
          pvVar7 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                   ::loc.logger_;
          LVar6 = pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::loc.level_;
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.logger_enabled_ == true) {
            this_00 = (psVar15->
                      super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            pcVar4 = (this_00->caller_id_)._M_dataplus._M_p;
            pcVar5 = (this->name_)._M_dataplus._M_p;
            psVar13 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(this_00);
            console::print((FilterBase *)0x0,pvVar7,LVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x13d,"bool miniros::Subscription::pubUpdate(const V_string &)",
                           "Disconnecting from publisher [%s] of topic [%s] at [%s]",pcVar4,pcVar5,
                           (psVar13->_M_dataplus)._M_p);
          }
          (*((psVar15->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_PublisherLink[5])();
        }
        psVar15 = psVar15 + 1;
      } while (psVar15 != psVar18);
    }
    pbVar17 = additions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = true;
    if (additions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        additions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar16 = additions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((ownURI._M_string_length == pbVar16->_M_string_length) &&
           ((ownURI._M_string_length == 0 ||
            (iVar10 = bcmp(ownURI._M_dataplus._M_p,(pbVar16->_M_dataplus)._M_p,
                           ownURI._M_string_length), iVar10 == 0)))) {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.initialized_ == false) {
            _ss = (pointer)local_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"miniros.subscription","")
            ;
            console::initializeLogLocation
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,(string *)&ss,Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_ss != local_1a8) {
              operator_delete(_ss,local_1a8[0]._M_allocated_capacity + 1);
            }
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc,Debug);
            console::checkLogLocationEnabled
                      (&pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                        ::loc);
          }
          if (pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::loc.logger_,
                           pubUpdate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x14f,"bool miniros::Subscription::pubUpdate(const V_string &)",
                           "Skipping myself (%s, %s)",(this->name_)._M_dataplus._M_p,
                           ownURI._M_dataplus._M_p);
          }
        }
        else {
          bVar9 = negotiateConnection(this,pbVar16);
          bVar8 = (bool)(bVar8 & bVar9);
        }
        pbVar16 = pbVar16 + 1;
      } while (pbVar16 != pbVar17);
    }
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector(&to_add);
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::~vector(&subtractions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&additions);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ownURI._M_dataplus._M_p != &ownURI.field_2) {
      operator_delete(ownURI._M_dataplus._M_p,ownURI.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar8 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->shutdown_mutex_);
  return bVar8;
}

Assistant:

bool Subscription::pubUpdate(const V_string& new_pubs)
{
  std::scoped_lock<std::mutex> slock(shutdown_mutex_);

  if (shutting_down_ || dropped_)
  {
    return false;
  }

  bool retval = true;

  const std::string ownURI = RPCManager::instance()->getServerURI();
  {
    std::stringstream ss;

    for (const std::string& up_i: new_pubs)
      ss << up_i << ", ";

    ss << " already have these connections: ";
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      for (PublisherLinkPtr& plink: publisher_links_)
        ss << plink->getPublisherXMLRPCURI() << ", ";
    }

    {
      std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
      for (const PendingConnectionPtr& conn: pending_connections_)
        ss << conn->getRemoteURI() << ", ";
    }

    MINIROS_DEBUG("Publisher update for [%s]: %s", name_.c_str(), ss.str().c_str());
  }

  V_string additions;
  V_PublisherLink subtractions;
  V_PublisherLink to_add;
  // could use the STL set operations... but these sets are so small
  // it doesn't really matter.
  {
    std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

    for (V_PublisherLink::iterator spc = publisher_links_.begin();
         spc!= publisher_links_.end(); ++spc)
    {
      bool found = false;
      for (V_string::const_iterator up_i = new_pubs.begin();
           !found && up_i != new_pubs.end(); ++up_i)
      {
        if (urisEqual((*spc)->getPublisherXMLRPCURI(), *up_i))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        subtractions.push_back(*spc);
      }
    }

    for (V_string::const_iterator up_i  = new_pubs.begin(); up_i != new_pubs.end(); ++up_i)
    {
      bool found = false;
      for (V_PublisherLink::iterator spc = publisher_links_.begin();
           !found && spc != publisher_links_.end(); ++spc)
      {
        if (urisEqual(*up_i, (*spc)->getPublisherXMLRPCURI()))
        {
          found = true;
          break;
        }
      }

      if (!found)
      {
        std::scoped_lock<std::mutex> lock(pending_connections_mutex_);
        for (const PendingConnectionPtr& conn: pending_connections_)
        {
          if (urisEqual(*up_i, conn->getRemoteURI()))
          {
            found = true;
            break;
          }
        }
      }

      if (!found)
      {
        additions.push_back(*up_i);
      }
    }
  }

  for (const PublisherLinkPtr& link: subtractions)
  {
    if (link->getPublisherXMLRPCURI() != ownURI)
    {
      MINIROS_DEBUG("Disconnecting from publisher [%s] of topic [%s] at [%s]",
                  link->getCallerID().c_str(), name_.c_str(), link->getPublisherXMLRPCURI().c_str());
      link->drop();
    }
    else
    {
      MINIROS_DEBUG("Disconnect: skipping myself for topic [%s]", name_.c_str());
    }
  }

  for (const std::string& uri: additions)
  {
    // this function should never negotiate a self-subscription
    if (ownURI != uri)
    {
      retval &= negotiateConnection(uri);
    }
    else
    {
      MINIROS_DEBUG("Skipping myself (%s, %s)", name_.c_str(), ownURI.c_str());
    }
  }

  return retval;
}